

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_String __thiscall
ON_Font::CleanFontName(ON_Font *this,wchar_t *dirty_font_name,ON_StringMapOrdinalType map)

{
  ON_wString local_68;
  wchar_t local_5c;
  wchar_t *pwStack_58;
  wchar_t c;
  wchar_t *s;
  wchar_t *pwStack_48;
  bool bMap;
  wchar_t *s1;
  wchar_t *local_30;
  wchar_t *s0;
  ON_wString clean_font_name;
  ON_StringMapOrdinalType map_local;
  wchar_t *dirty_font_name_local;
  
  clean_font_name.m_s._4_4_ = map;
  ON_wString::ON_wString((ON_wString *)&s0,dirty_font_name);
  pwStack_48 = ON_wString::Array((ON_wString *)&s0);
  s._7_1_ = clean_font_name.m_s._4_4_ != Identity;
  local_5c = *pwStack_48;
  local_30 = pwStack_48;
  pwStack_58 = pwStack_48;
  while (pwStack_58 = pwStack_58 + 1, local_5c != L'\0') {
    if (((local_5c != L' ') && (local_5c != L'-')) && (local_5c != L'_')) {
      if ((s._7_1_ & 1) != 0) {
        local_5c = ON_wString::MapCharacterOrdinal(clean_font_name.m_s._4_4_,local_5c);
      }
      *pwStack_48 = local_5c;
      pwStack_48 = pwStack_48 + 1;
    }
    local_5c = *pwStack_58;
  }
  *pwStack_48 = L'\0';
  ON_wString::SetLength((ON_wString *)&s0,(long)pwStack_48 - (long)local_30 >> 2);
  if (clean_font_name.m_s._4_4_ == Identity) {
    ON_String::ON_String((ON_String *)this,(ON_wString *)&s0);
  }
  else {
    ON_wString::MapStringOrdinal(&local_68,(ON_StringMapOrdinalType)&s0);
    ON_String::ON_String((ON_String *)this,&local_68);
    ON_wString::~ON_wString(&local_68);
  }
  ON_wString::~ON_wString((ON_wString *)&s0);
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_Font::CleanFontName(
  const wchar_t* dirty_font_name,
  ON_StringMapOrdinalType map
)
{
  ON_wString clean_font_name(dirty_font_name);
  wchar_t* s0 = clean_font_name.Array();
  wchar_t* s1 = s0;
  const bool bMap = (ON_StringMapOrdinalType::Identity != map);
  for (wchar_t* s = s0, c = *s++; 0 != c; c = *s++)
  {
    if (
      ON_wString::Space == c
      || ON_wString::HyphenMinus == c
      || ON_wString::Underscore == c
      )
    {
      // PostScript, DWrite, LOGFONT all treat spaces, underbars and hyphens
      // differently. The purpose of this function is to get a string that
      // can be used to search for matching fonts. Ignoring spaces, underbars and hyphens
      // makes it possible to find installed fonts using a "dirty name" from another computer.
      continue;
    }
    if (bMap)
      c = ON_wString::MapCharacterOrdinal(map, c);
    *s1++ = c;
  }
  *s1 = 0;
  clean_font_name.SetLength(s1 - s0);
  if (map != ON_StringMapOrdinalType::Identity)
  {
    return clean_font_name.MapStringOrdinal(map);
  }
  return clean_font_name;
}